

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_asn1.cc
# Opt level: O1

DSA_SIG * d2i_DSA_SIG(DSA_SIG **v,uchar **pp,long length)

{
  DSA_SIG *pDVar1;
  CBS cbs;
  CBS local_28;
  
  if (-1 < length) {
    local_28.data = *pp;
    local_28.len = length;
    pDVar1 = (DSA_SIG *)DSA_SIG_parse(&local_28);
    if (pDVar1 != (DSA_SIG *)0x0) {
      if (v != (DSA_SIG **)0x0) {
        DSA_SIG_free(*v);
        *v = pDVar1;
      }
      *pp = local_28.data;
      return pDVar1;
    }
  }
  return (DSA_SIG *)0x0;
}

Assistant:

DSA_SIG *d2i_DSA_SIG(DSA_SIG **out_sig, const uint8_t **inp, long len) {
  if (len < 0) {
    return NULL;
  }
  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  DSA_SIG *ret = DSA_SIG_parse(&cbs);
  if (ret == NULL) {
    return NULL;
  }
  if (out_sig != NULL) {
    DSA_SIG_free(*out_sig);
    *out_sig = ret;
  }
  *inp = CBS_data(&cbs);
  return ret;
}